

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStepInnerStepper_Evolve
              (MRIStepInnerStepper stepper,sunrealtype t0,sunrealtype tout,N_Vector y)

{
  MRIStepInnerEvolveFn p_Var1;
  int iVar2;
  
  iVar2 = -0x16;
  if (((stepper != (MRIStepInnerStepper)0x0) && (stepper->ops != (MRIStepInnerStepper_Ops)0x0)) &&
     (p_Var1 = stepper->ops->evolve, p_Var1 != (MRIStepInnerEvolveFn)0x0)) {
    iVar2 = (*p_Var1)(stepper,t0,tout,y);
    stepper->last_flag = iVar2;
  }
  return iVar2;
}

Assistant:

int mriStepInnerStepper_Evolve(MRIStepInnerStepper stepper, sunrealtype t0,
                               sunrealtype tout, N_Vector y)
{
  if (stepper == NULL) { return ARK_ILL_INPUT; }
  if (stepper->ops == NULL) { return ARK_ILL_INPUT; }
  if (stepper->ops->evolve == NULL) { return ARK_ILL_INPUT; }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(stepper->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "ARKODE::mriStepInnerStepper_Evolve", "start-inner-evolve",
                     "t0 = %" RSYM ", tout = %" RSYM, t0, tout);
#endif

  stepper->last_flag = stepper->ops->evolve(stepper, t0, tout, y);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(stepper->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "ARKODE::mriStepInnerStepper_Evolve", "end-inner-evolve",
                     "flag = %i", stepper->last_flag);
#endif

  return stepper->last_flag;
}